

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall
preprocessor_test_empty_Test::~preprocessor_test_empty_Test(preprocessor_test_empty_Test *this)

{
  void *in_RDI;
  
  ~preprocessor_test_empty_Test((preprocessor_test_empty_Test *)0x111db8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(preprocessor_test, empty)
{
	const char empty_str[] = "";

	EXPECT_STREQ("", PREPROCESSOR_STRINGIFY_OR_EMPTY(PREPROCESSOR_EMPTY_SYMBOL()));
	EXPECT_STREQ(empty_str, PREPROCESSOR_STRINGIFY_OR_EMPTY(PREPROCESSOR_EMPTY_SYMBOL()));

	PREPROCESSOR_EMPTY_EXPANSION(this must compile)

	PREPROCESSOR_EMPTY_EXPANSION_VARIADIC(this, must, compile)
}

TEST_F(preprocessor_test, foreach)
{
#define PREPROCESSOR_TEST_FOR_EACH_STR_SIZE 0x04

	char for_each_str[PREPROCESSOR_TEST_FOR_EACH_STR_SIZE];

	memset(for_each_str, '\0', sizeof(char) * PREPROCESSOR_TEST_FOR_EACH_STR_SIZE);

#define PREPROCESSOR_TEST_FOR_EACH(expr) strncat(for_each_str, expr, PREPROCESSOR_TEST_FOR_EACH_STR_SIZE - 1);

	PREPROCESSOR_FOR_EACH(PREPROCESSOR_TEST_FOR_EACH, "a", "b", "c")

#undef PREPROCESSOR_TEST_FOR_EACH

#undef PREPROCESSOR_TEST_FOR_EACH_STR_SIZE

	EXPECT_STREQ(for_each_str, "abc");
}

TEST_F(preprocessor_test, foreach_empty)
{
#define PREPROCESSOR_TEST_FOR_EACH(expr) "33434"

	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_EMPTY(PREPROCESSOR_FOR_EACH(PREPROCESSOR_TEST_FOR_EACH)));

#undef PREPROCESSOR_TEST_FOR_EACH
}

TEST_F(preprocessor_test, for_empty)
{
#define PREPROCESSOR_TEST_FOR(context, iterator, element) "33434"

	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_EMPTY(PREPROCESSOR_FOR(PREPROCESSOR_TEST_FOR, "yeet")));

#undef PREPROCESSOR_TEST_FOR
}

TEST_F(preprocessor_test, for)
{
#define PREPROCESSOR_TEST_FOR(context, iterator, element) \
	context \
		PREPROCESSOR_STRINGIFY(iterator) \
			element \
		"-"

	const char for_str[] = PREPROCESSOR_FOR(PREPROCESSOR_TEST_FOR, "yeet", "a", "b", "c", "d", "e", "f");

#undef PREPROCESSOR_TEST_FOR

	EXPECT_STREQ(for_str, "yeet0a-yeet1b-yeet2c-yeet3d-yeet4e-yeet5f-");
}

TEST_F(preprocessor_test, if)
{
	EXPECT_EQ((int)0, PREPROCESSOR_IF(1, (int)0, (int)1));

	EXPECT_NE((int)0, PREPROCESSOR_IF(0, (int)0, (int)1));
}

TEST_F(preprocessor_test, serial)
{
#define PREPROCSSOR_TEST_SERIAL_TAG abc

	const char serial_id_a[] = PREPROCESSOR_STRINGIFY(PREPROCESSOR_SERIAL_ID(PREPROCESSOR_TEST_SERIAL_TAG));

	const char serial_id_b[] = PREPROCESSOR_STRINGIFY(PREPROCESSOR_SERIAL_ID(PREPROCESSOR_TEST_SERIAL_TAG));

	EXPECT_STRNE(serial_id_a, serial_id_b);

#undef PREPROCESSOR_TEST_SERIAL_TAG
}

TEST_F(preprocessor_test, stringify)
{
#define PREPROCESSOR_TEST_STRINGIFY_TAG abc

	const char stringify_tag[] = "abc";

	EXPECT_STREQ(stringify_tag, PREPROCESSOR_STRINGIFY(PREPROCESSOR_TEST_STRINGIFY_TAG));

	EXPECT_STREQ(stringify_tag, PREPROCESSOR_STRINGIFY_VARIADIC(a, b, c));

#undef PREPROCESSOR_TEST_STRINGIFY_TAG
}

TEST_F(preprocessor_test, tuple)
{
	EXPECT_EQ((int)0, PREPROCESSOR_TUPLE_EXPAND(PREPROCESSOR_TUPLE_MAKE((int)0)));

	PREPROCESSOR_TUPLE_EXPAND_MACRO(EXPECT_EQ, PREPROCESSOR_TUPLE_PREPEND((int)1, PREPROCESSOR_TUPLE_MAKE((int)1)));

	PREPROCESSOR_TUPLE_EXPAND_MACRO(EXPECT_NE, PREPROCESSOR_TUPLE_APPEND((int)1, PREPROCESSOR_TUPLE_MAKE((int)0)));
}

TEST_F(preprocessor_test, if_with_arguments_count)
{
	EXPECT_EQ((int)1, (int)PREPROCESSOR_IF(PREPROCESSOR_ARGS_COUNT(a, b, c), 1, 0));
}